

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int bgzf_index_add_block(BGZF *fp)

{
  bgzidx1_t *pbVar1;
  BGZF *fp_local;
  
  fp->idx->noffs = fp->idx->noffs + 1;
  if (fp->idx->moffs < fp->idx->noffs) {
    fp->idx->moffs = fp->idx->noffs;
    fp->idx->moffs = fp->idx->moffs + -1;
    fp->idx->moffs = fp->idx->moffs >> 1 | fp->idx->moffs;
    fp->idx->moffs = fp->idx->moffs >> 2 | fp->idx->moffs;
    fp->idx->moffs = fp->idx->moffs >> 4 | fp->idx->moffs;
    fp->idx->moffs = fp->idx->moffs >> 8 | fp->idx->moffs;
    fp->idx->moffs = fp->idx->moffs >> 0x10 | fp->idx->moffs;
    fp->idx->moffs = fp->idx->moffs + 1;
    pbVar1 = (bgzidx1_t *)realloc(fp->idx->offs,(long)fp->idx->moffs << 4);
    fp->idx->offs = pbVar1;
    if (fp->idx->offs == (bgzidx1_t *)0x0) {
      return -1;
    }
  }
  fp->idx->offs[fp->idx->noffs + -1].uaddr = fp->idx->ublock_addr;
  fp->idx->offs[fp->idx->noffs + -1].caddr = fp->block_address;
  return 0;
}

Assistant:

int bgzf_index_add_block(BGZF *fp)
{
    fp->idx->noffs++;
    if ( fp->idx->noffs > fp->idx->moffs )
    {
        fp->idx->moffs = fp->idx->noffs;
        kroundup32(fp->idx->moffs);
        fp->idx->offs = (bgzidx1_t*) realloc(fp->idx->offs, fp->idx->moffs*sizeof(bgzidx1_t));
        if ( !fp->idx->offs ) return -1;
    }
    fp->idx->offs[ fp->idx->noffs-1 ].uaddr = fp->idx->ublock_addr;
    fp->idx->offs[ fp->idx->noffs-1 ].caddr = fp->block_address;
    return 0;
}